

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

bool __thiscall QRasterPaintEngine::begin(QRasterPaintEngine *this,QPaintDevice *device)

{
  undefined1 *puVar1;
  QRect *clipRect;
  QPaintEnginePrivate *pQVar2;
  QPaintEngineState *pQVar3;
  int iVar4;
  QPlatformPixmap *pQVar5;
  undefined4 extraout_var;
  QPaintEngineState *pQVar6;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  iVar4 = (*device->_vptr_QPaintDevice[2])(device);
  if (iVar4 == 2) {
    pQVar5 = QPixmap::handle((QPixmap *)device);
    if ((pQVar5->id & 0xfffffffdU) == 0) {
      iVar4 = (*pQVar5->_vptr_QPlatformPixmap[0x16])(pQVar5);
      device = (QPaintDevice *)CONCAT44(extraout_var,iVar4);
      pQVar2[3].systemTransform.m_matrix[0][0] = (qreal)device;
    }
    else {
      device = (QPaintDevice *)pQVar2[3].systemTransform.m_matrix[0][0];
    }
  }
  else {
    pQVar2[3].systemTransform.m_matrix[0][0] = (qreal)device;
  }
  pQVar2->pdev = device;
  (*pQVar2->_vptr_QPaintEnginePrivate[2])(pQVar2);
  pQVar3 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar6 = pQVar3 + -2;
  if (pQVar3 == (QPaintEngineState *)0x0) {
    pQVar6 = (QPaintEngineState *)0x0;
  }
  ensureOutlineMapper(this);
  clipRect = (QRect *)(pQVar2[3].systemTransform.m_matrix + 1);
  QOutlineMapper::setClipRect
            ((QOutlineMapper *)pQVar2[3].systemTransform.m_matrix[0][1],
             *(QRect *)(pQVar2[3].systemTransform.m_matrix + 1));
  QRasterizer::setClipRect((QRasterizer *)pQVar2[10].systemClip.d,clipRect);
  QSpanData::init((QSpanData *)(pQVar6 + 0x72),
                  (EVP_PKEY_CTX *)pQVar2[3].systemTransform.m_matrix[0][2]);
  QPen::brush((QPen *)&local_58);
  QSpanData::setup((QSpanData *)(pQVar6 + 0x72),(QBrush *)&local_58,
                   pQVar6[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   pQVar6[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   (bool)(*(byte *)((long)&pQVar6[0x105].dirtyFlags.
                                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i + 1) & 1))
  ;
  QBrush::~QBrush((QBrush *)&local_58);
  *(qreal **)(pQVar6 + 0xb4) = pQVar2[3].systemTransform.m_matrix[2] + 1;
  QRectF::QRectF(&local_58,clipRect);
  pQVar2[4].pdev = (QPaintDevice *)local_58.w;
  pQVar2[4].q_ptr = (QPaintEngine *)local_58.h;
  *(qreal *)&pQVar2[3].field_0x98 = local_58.xp;
  pQVar2[4]._vptr_QPaintEnginePrivate = (_func_int **)local_58.yp;
  QSpanData::init((QSpanData *)(pQVar6 + 0xba),
                  (EVP_PKEY_CTX *)pQVar2[3].systemTransform.m_matrix[0][2]);
  QSpanData::setup((QSpanData *)(pQVar6 + 0xba),(QBrush *)(pQVar6 + 0x12),
                   pQVar6[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   pQVar6[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   (bool)(*(byte *)((long)&pQVar6[0x105].dirtyFlags.
                                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i + 1) & 1))
  ;
  *(undefined4 *)((long)pQVar2[3].systemTransform.m_matrix[0][2] + 0xc) = 0;
  pQVar6 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  (pQVar6->dirtyFlags).super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i =
       (pQVar6->dirtyFlags).super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
       super_QFlagsStorage<QPaintEngine::DirtyFlag>.i | 4;
  *(uint *)&pQVar2[10].pdev = 2 - (*(byte *)((long)&pQVar2[10].baseSystemClip.d + 4) & 1);
  puVar1 = &(this->super_QPaintEngineEx).super_QPaintEngine.field_0x14;
  *puVar1 = *puVar1 | 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QRasterPaintEngine::begin(QPaintDevice *device)
{
    Q_D(QRasterPaintEngine);

    if (device->devType() == QInternal::Pixmap) {
        QPixmap *pixmap = static_cast<QPixmap *>(device);
        QPlatformPixmap *pd = pixmap->handle();
        if (pd->classId() == QPlatformPixmap::RasterClass || pd->classId() == QPlatformPixmap::BlitterClass)
            d->device = pd->buffer();
    } else {
        d->device = device;
    }

    // Make sure QPaintEngine::paintDevice() returns the proper device.
    d->pdev = d->device;

    Q_ASSERT(d->device->devType() == QInternal::Image
             || d->device->devType() == QInternal::CustomRaster);

    d->systemStateChanged();

    QRasterPaintEngineState *s = state();
    ensureOutlineMapper();
    d->outlineMapper->setClipRect(d->deviceRect);
    d->rasterizer->setClipRect(d->deviceRect);

    s->penData.init(d->rasterBuffer.data(), this);
    s->penData.setup(s->pen.brush(), s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);
    s->stroker = &d->basicStroker;
    d->basicStroker.setClipRect(d->deviceRect);

    s->brushData.init(d->rasterBuffer.data(), this);
    s->brushData.setup(s->brush, s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);

    d->rasterBuffer->compositionMode = QPainter::CompositionMode_SourceOver;

    setDirty(DirtyBrushOrigin);

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::begin(" << (void *) device
             << ") devType:" << device->devType()
             << "devRect:" << d->deviceRect;
    if (d->baseClip) {
        dumpClip(d->rasterBuffer->width(), d->rasterBuffer->height(), &*d->baseClip);
    }
#endif

    if (d->mono_surface)
        d->glyphCacheFormat = QFontEngine::Format_Mono;
#if defined(Q_OS_WIN)
    else if (clearTypeFontsEnabled())
#else
    else if (false)
#endif
    {
        QImage::Format format = static_cast<QImage *>(d->device)->format();
        if (format == QImage::Format_ARGB32_Premultiplied || format == QImage::Format_RGB32)
            d->glyphCacheFormat = QFontEngine::Format_A32;
        else
            d->glyphCacheFormat = QFontEngine::Format_A8;
    } else
        d->glyphCacheFormat = QFontEngine::Format_A8;

    setActive(true);
    return true;
}